

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

bool __thiscall
arangodb::velocypack::Builder::closeCompactArrayOrObject
          (Builder *this,ValueLength pos,bool isArray,iterator indexStart,iterator indexEnd)

{
  ValueLength value;
  ValueLength VVar1;
  ValueLength VVar2;
  uint8_t uVar3;
  Builder *this_00;
  byte in_DL;
  Builder *in_RSI;
  Builder *in_RDI;
  ValueLength len;
  ValueLength targetPos;
  ValueLength bLen;
  ValueLength byteSize;
  ValueLength nLen;
  size_t n;
  size_t in_stack_ffffffffffffff78;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff88;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff90;
  ulong local_68;
  ValueLength local_60;
  bool local_9;
  
  value = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  VVar1 = getVariableValueLength(value);
  local_60 = (in_RDI->_pos -
             (long)&(in_RSI->_buffer).
                    super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount) + VVar1;
  local_68 = getVariableValueLength(local_60);
  local_60 = local_68 + local_60;
  VVar2 = getVariableValueLength(local_60);
  if (VVar2 != local_68) {
    local_60 = local_60 + 1;
    local_68 = local_68 + 1;
  }
  if (local_68 < 9) {
    uVar3 = '\x14';
    if ((in_DL & 1) != 0) {
      uVar3 = '\x13';
    }
    in_RDI->_start[(long)in_RSI] = uVar3;
    this_00 = (Builder *)(local_68 + 1);
    if ((undefined1 *)
        ((long)&(in_RSI->_buffer).
                super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi + 1U) < (undefined1 *)in_RDI->_pos) {
      in_stack_ffffffffffffff88._M_current =
           (unsigned_long *)
           (in_RDI->_pos -
           (long)((long)&(in_RSI->_buffer).
                         super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 1));
      memmove(in_RDI->_start + (long)in_RSI + (long)this_00,in_RDI->_start + (long)in_RSI + 9,
              (size_t)in_stack_ffffffffffffff88._M_current);
    }
    storeVariableValueLength<false>(in_RDI->_start + (long)in_RSI + 1,local_60);
    if (8 - local_68 < VVar1) {
      reserve(this_00,(ValueLength)in_stack_ffffffffffffff88._M_current);
    }
    storeVariableValueLength<true>(in_RDI->_start + (long)in_RSI + (local_60 - 1),value);
    rollback(in_RDI,in_stack_ffffffffffffff78);
    advance(in_RDI,in_stack_ffffffffffffff78);
    closeLevel(in_RSI);
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool Builder::closeCompactArrayOrObject(
    ValueLength pos, bool isArray,
    std::vector<ValueLength>::iterator indexStart,
    std::vector<ValueLength>::iterator indexEnd) {
  std::size_t const n = std::distance(indexStart, indexEnd);

  // use compact notation
  ValueLength nLen = getVariableValueLength(static_cast<ValueLength>(n));
  VELOCYPACK_ASSERT(nLen > 0);
  ValueLength byteSize = _pos - (pos + 8) + nLen;
  VELOCYPACK_ASSERT(byteSize > 0);
  ValueLength bLen = getVariableValueLength(byteSize);
  byteSize += bLen;
  if (getVariableValueLength(byteSize) != bLen) {
    byteSize += 1;
    bLen += 1;
  }

  if (bLen < 9) {
    // can only use compact notation if total byte length is at most 8 bytes
    // long
    _start[pos] = (isArray ? 0x13 : 0x14);
    ValueLength targetPos = 1 + bLen;

    if (_pos > (pos + 9)) {
      ValueLength len = _pos - (pos + 9);
      memmove(_start + pos + targetPos, _start + pos + 9, checkOverflow(len));
    }

    // store byte length
    VELOCYPACK_ASSERT(byteSize > 0);
    storeVariableValueLength<false>(_start + pos + 1, byteSize);

    // need additional memory for storing the number of values
    if (nLen > 8 - bLen) {
      reserve(nLen);
    }
    storeVariableValueLength<true>(_start + pos + byteSize - 1,
                                   static_cast<ValueLength>(n));

    rollback(8);
    advance(nLen + bLen);

    closeLevel();

#ifdef VELOCYPACK_DEBUG
    VELOCYPACK_ASSERT(_start[pos] == (isArray ? 0x13 : 0x14));
    VELOCYPACK_ASSERT(byteSize ==
                      readVariableValueLength<false>(_start + pos + 1));
    VELOCYPACK_ASSERT(isArray || _start[pos + 1 + bLen] != 0x00);
    VELOCYPACK_ASSERT(
        n == readVariableValueLength<true>(_start + pos + byteSize - 1));
#endif
    return true;
  }
  return false;
}